

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_system.cpp
# Opt level: O0

int main(int argc,char **argv,char **env)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  ostream *poVar4;
  runtime_error *prVar5;
  char *pcVar6;
  char *__end;
  exception *e;
  string local_1650 [32];
  ostringstream local_1630 [8];
  ostringstream ss_12;
  allocator<char> local_14b1;
  string local_14b0 [8];
  string command;
  string local_1488 [32];
  ostringstream local_1468 [8];
  ostringstream ss_11;
  string local_12e8 [32];
  ostringstream local_12c8 [8];
  ostringstream ss_10;
  string local_1148 [32];
  ostringstream local_1128 [8];
  ostringstream ss_9;
  string local_fa8 [32];
  ostringstream local_f88 [8];
  ostringstream ss_8;
  string local_e08 [32];
  ostringstream local_de8 [8];
  ostringstream ss_7;
  string local_c68 [32];
  ostringstream local_c48 [8];
  ostringstream ss_6;
  allocator<char> local_ac9;
  undefined1 local_ac8 [8];
  string value;
  string local_aa0 [8];
  string key;
  string local_a78 [32];
  ostringstream local_a58 [8];
  ostringstream ss_5;
  char *key_end;
  char *eptr;
  char **e_1;
  undefined1 local_8c0 [7];
  bool found;
  string sample;
  string local_898 [32];
  ostringstream local_878 [8];
  ostringstream ss_4;
  string local_6f8 [32];
  ostringstream local_6d8 [8];
  ostringstream ss_3;
  string local_558 [32];
  ostringstream local_538 [8];
  ostringstream ss_2;
  string local_3b8 [32];
  ostringstream local_398 [8];
  ostringstream ss_1;
  string local_218 [32];
  ostringstream local_1f8 [8];
  ostringstream ss;
  args local_7a;
  allocator<wchar_t> local_79;
  wstring local_78 [6];
  args a;
  wstring wexample;
  allocator<char> local_41;
  undefined1 local_40 [8];
  string example;
  char **env_local;
  char **argv_local;
  int argc_local;
  
  argv_local._4_4_ = 0;
  example.field_2._8_8_ = env;
  env_local = argv;
  argv_local._0_4_ = argc;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_40,anon_var_dwarf_3caf,&local_41);
  std::allocator<char>::~allocator(&local_41);
  std::allocator<wchar_t>::allocator();
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>(local_78,L"ש-м-ν",&local_79);
  std::allocator<wchar_t>::~allocator(&local_79);
  boost::nowide::args::args
            (&local_7a,(int *)&argv_local,&env_local,(char ***)((long)&example.field_2 + 8));
  if (((int)argv_local == 2) && (*env_local[1] != '-')) {
    bVar1 = std::operator==(env_local[1],
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_40);
    if (!bVar1) {
      std::__cxx11::ostringstream::ostringstream(local_1f8);
      poVar4 = std::operator<<((ostream *)local_1f8,"Error argv[1]==example in ");
      poVar4 = std::operator<<(poVar4,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/halex2005[P]boost-nowide/test/test_system.cpp"
                              );
      poVar4 = std::operator<<(poVar4,':');
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,0x19);
      poVar4 = std::operator<<(poVar4," ");
      std::operator<<(poVar4,"main");
      prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::ostringstream::str();
      std::runtime_error::runtime_error(prVar5,local_218);
      __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    if (env_local[2] != (char *)0x0) {
      std::__cxx11::ostringstream::ostringstream(local_398);
      poVar4 = std::operator<<((ostream *)local_398,"Error argv[2] == 0 in ");
      poVar4 = std::operator<<(poVar4,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/halex2005[P]boost-nowide/test/test_system.cpp"
                              );
      poVar4 = std::operator<<(poVar4,':');
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,0x1a);
      poVar4 = std::operator<<(poVar4," ");
      std::operator<<(poVar4,"main");
      prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::ostringstream::str();
      std::runtime_error::runtime_error(prVar5,local_3b8);
      __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    pcVar6 = getenv("NOWIDE_TEST");
    if (pcVar6 == (char *)0x0) {
      std::__cxx11::ostringstream::ostringstream(local_538);
      poVar4 = std::operator<<((ostream *)local_538,"Error nowide::getenv(\"NOWIDE_TEST\") in ");
      poVar4 = std::operator<<(poVar4,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/halex2005[P]boost-nowide/test/test_system.cpp"
                              );
      poVar4 = std::operator<<(poVar4,':');
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,0x1b);
      poVar4 = std::operator<<(poVar4," ");
      std::operator<<(poVar4,"main");
      prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::ostringstream::str();
      std::runtime_error::runtime_error(prVar5,local_558);
      __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    pcVar6 = getenv("NOWIDE_TEST_NONE");
    if (pcVar6 != (char *)0x0) {
      std::__cxx11::ostringstream::ostringstream(local_6d8);
      poVar4 = std::operator<<((ostream *)local_6d8,
                               "Error nowide::getenv(\"NOWIDE_TEST_NONE\") == 0 in ");
      poVar4 = std::operator<<(poVar4,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/halex2005[P]boost-nowide/test/test_system.cpp"
                              );
      poVar4 = std::operator<<(poVar4,':');
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,0x1c);
      poVar4 = std::operator<<(poVar4," ");
      std::operator<<(poVar4,"main");
      prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::ostringstream::str();
      std::runtime_error::runtime_error(prVar5,local_6f8);
      __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    pcVar6 = getenv("NOWIDE_TEST");
    bVar1 = std::operator==(pcVar6,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)local_40);
    if (!bVar1) {
      std::__cxx11::ostringstream::ostringstream(local_878);
      poVar4 = std::operator<<((ostream *)local_878,
                               "Error nowide::getenv(\"NOWIDE_TEST\")==example in ");
      poVar4 = std::operator<<(poVar4,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/halex2005[P]boost-nowide/test/test_system.cpp"
                              );
      poVar4 = std::operator<<(poVar4,':');
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,0x1d);
      poVar4 = std::operator<<(poVar4," ");
      std::operator<<(poVar4,"main");
      sample.field_2._M_local_buf[0xf] = '\x01';
      prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::ostringstream::str();
      std::runtime_error::runtime_error(prVar5,local_898);
      sample.field_2._M_local_buf[0xf] = '\0';
      __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_8c0,
                   "NOWIDE_TEST=",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40);
    bVar1 = false;
    for (eptr = (char *)example.field_2._8_8_; *(long *)eptr != 0; eptr = eptr + 8) {
      pcVar6 = *(char **)eptr;
      __end = strchr(pcVar6,0x3d);
      if (__end == (char *)0x0) {
        std::__cxx11::ostringstream::ostringstream(local_a58);
        poVar4 = std::operator<<((ostream *)local_a58,"Error key_end in ");
        poVar4 = std::operator<<(poVar4,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/halex2005[P]boost-nowide/test/test_system.cpp"
                                );
        poVar4 = std::operator<<(poVar4,':');
        poVar4 = (ostream *)std::ostream::operator<<(poVar4,0x24);
        poVar4 = std::operator<<(poVar4," ");
        std::operator<<(poVar4,"main");
        key.field_2._M_local_buf[0xf] = '\x01';
        prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::__cxx11::ostringstream::str();
        std::runtime_error::runtime_error(prVar5,local_a78);
        key.field_2._M_local_buf[0xf] = '\0';
        __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      std::allocator<char>::allocator();
      std::__cxx11::string::string<char*,void>
                (local_aa0,pcVar6,__end,(allocator<char> *)(value.field_2._M_local_buf + 0xf));
      std::allocator<char>::~allocator((allocator<char> *)(value.field_2._M_local_buf + 0xf));
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)local_ac8,__end + 1,&local_ac9);
      std::allocator<char>::~allocator(&local_ac9);
      pcVar6 = (char *)std::__cxx11::string::c_str();
      pcVar6 = getenv(pcVar6);
      if (pcVar6 == (char *)0x0) {
        std::__cxx11::ostringstream::ostringstream(local_c48);
        poVar4 = std::operator<<((ostream *)local_c48,"Error nowide::getenv(key.c_str()) in ");
        poVar4 = std::operator<<(poVar4,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/halex2005[P]boost-nowide/test/test_system.cpp"
                                );
        poVar4 = std::operator<<(poVar4,':');
        poVar4 = (ostream *)std::ostream::operator<<(poVar4,0x27);
        poVar4 = std::operator<<(poVar4," ");
        std::operator<<(poVar4,"main");
        prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::__cxx11::ostringstream::str();
        std::runtime_error::runtime_error(prVar5,local_c68);
        __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      pcVar6 = (char *)std::__cxx11::string::c_str();
      pcVar6 = getenv(pcVar6);
      bVar2 = std::operator==(pcVar6,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)local_ac8);
      if (!bVar2) {
        std::__cxx11::ostringstream::ostringstream(local_de8);
        poVar4 = std::operator<<((ostream *)local_de8,
                                 "Error nowide::getenv(key.c_str()) == value in ");
        poVar4 = std::operator<<(poVar4,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/halex2005[P]boost-nowide/test/test_system.cpp"
                                );
        poVar4 = std::operator<<(poVar4,':');
        poVar4 = (ostream *)std::ostream::operator<<(poVar4,0x28);
        poVar4 = std::operator<<(poVar4," ");
        std::operator<<(poVar4,"main");
        prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::__cxx11::ostringstream::str();
        std::runtime_error::runtime_error(prVar5,local_e08);
        __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      bVar2 = std::operator==(*(char **)eptr,
                              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_8c0);
      if (bVar2) {
        bVar1 = true;
      }
      std::__cxx11::string::~string((string *)local_ac8);
      std::__cxx11::string::~string(local_aa0);
    }
    if (!bVar1) {
      std::__cxx11::ostringstream::ostringstream(local_f88);
      poVar4 = std::operator<<((ostream *)local_f88,"Error found in ");
      poVar4 = std::operator<<(poVar4,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/halex2005[P]boost-nowide/test/test_system.cpp"
                              );
      poVar4 = std::operator<<(poVar4,':');
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,0x2c);
      poVar4 = std::operator<<(poVar4," ");
      std::operator<<(poVar4,"main");
      prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::ostringstream::str();
      std::runtime_error::runtime_error(prVar5,local_fa8);
      __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    poVar4 = std::operator<<((ostream *)&std::cout,"Subprocess ok");
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string((string *)local_8c0);
  }
  else {
    if (((int)argv_local != 2) || (*env_local[1] != '-')) {
      poVar4 = std::operator<<((ostream *)&std::cerr,"Invalid parameters");
      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
      argv_local._4_4_ = 1;
      goto LAB_00104f43;
    }
    if (env_local[1][1] != 'n') {
      if (env_local[1][1] == 'w') {
        poVar4 = std::operator<<((ostream *)&std::cout,"Wide API is irrelevant");
        std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
        argv_local._4_4_ = 0;
      }
      else {
        poVar4 = std::operator<<((ostream *)&std::cout,"Invalid parameters expected \'-n/-w\'");
        std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
        argv_local._4_4_ = 1;
      }
      goto LAB_00104f43;
    }
    pcVar6 = (char *)std::__cxx11::string::c_str();
    iVar3 = setenv("NOWIDE_TEST",pcVar6,1);
    if (iVar3 != 0) {
      std::__cxx11::ostringstream::ostringstream(local_1128);
      poVar4 = std::operator<<((ostream *)local_1128,
                               "Error nowide::setenv(\"NOWIDE_TEST\",example.c_str(),1) == 0 in ");
      poVar4 = std::operator<<(poVar4,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/halex2005[P]boost-nowide/test/test_system.cpp"
                              );
      poVar4 = std::operator<<(poVar4,':');
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,0x41);
      poVar4 = std::operator<<(poVar4," ");
      std::operator<<(poVar4,"main");
      prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::ostringstream::str();
      std::runtime_error::runtime_error(prVar5,local_1148);
      __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    pcVar6 = (char *)std::__cxx11::string::c_str();
    iVar3 = setenv("NOWIDE_TEST_NONE",pcVar6,1);
    if (iVar3 != 0) {
      std::__cxx11::ostringstream::ostringstream(local_12c8);
      poVar4 = std::operator<<((ostream *)local_12c8,
                               "Error nowide::setenv(\"NOWIDE_TEST_NONE\",example.c_str(),1) == 0 in "
                              );
      poVar4 = std::operator<<(poVar4,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/halex2005[P]boost-nowide/test/test_system.cpp"
                              );
      poVar4 = std::operator<<(poVar4,':');
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,0x42);
      poVar4 = std::operator<<(poVar4," ");
      std::operator<<(poVar4,"main");
      prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::ostringstream::str();
      std::runtime_error::runtime_error(prVar5,local_12e8);
      __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    iVar3 = unsetenv("NOWIDE_TEST_NONE");
    if (iVar3 != 0) {
      std::__cxx11::ostringstream::ostringstream(local_1468);
      poVar4 = std::operator<<((ostream *)local_1468,
                               "Error nowide::unsetenv(\"NOWIDE_TEST_NONE\") == 0 in ");
      poVar4 = std::operator<<(poVar4,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/halex2005[P]boost-nowide/test/test_system.cpp"
                              );
      poVar4 = std::operator<<(poVar4,':');
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,0x43);
      poVar4 = std::operator<<(poVar4," ");
      std::operator<<(poVar4,"main");
      command.field_2._M_local_buf[0xf] = '\x01';
      prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::ostringstream::str();
      std::runtime_error::runtime_error(prVar5,local_1488);
      command.field_2._M_local_buf[0xf] = '\0';
      __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_14b0,"\"",&local_14b1);
    std::allocator<char>::~allocator(&local_14b1);
    std::__cxx11::string::operator+=(local_14b0,*env_local);
    std::__cxx11::string::operator+=(local_14b0,"\" ");
    std::__cxx11::string::operator+=(local_14b0,(string *)local_40);
    pcVar6 = (char *)std::__cxx11::string::c_str();
    iVar3 = system(pcVar6);
    if (iVar3 != 0) {
      std::__cxx11::ostringstream::ostringstream(local_1630);
      poVar4 = std::operator<<((ostream *)local_1630,
                               "Error nowide::system(command.c_str()) == 0 in ");
      poVar4 = std::operator<<(poVar4,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/halex2005[P]boost-nowide/test/test_system.cpp"
                              );
      poVar4 = std::operator<<(poVar4,':');
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,0x4d);
      poVar4 = std::operator<<(poVar4," ");
      std::operator<<(poVar4,"main");
      prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::ostringstream::str();
      std::runtime_error::runtime_error(prVar5,local_1650);
      __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    poVar4 = std::operator<<((ostream *)&std::cout,"Parent ok");
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string(local_14b0);
  }
  argv_local._4_4_ = 0;
LAB_00104f43:
  boost::nowide::args::~args(&local_7a);
  std::__cxx11::wstring::~wstring(local_78);
  std::__cxx11::string::~string((string *)local_40);
  return argv_local._4_4_;
}

Assistant:

int main(int argc,char **argv,char **env)
{
    try {
        std::string example = "\xd7\xa9-\xd0\xbc-\xce\xbd";
        std::wstring wexample = L"\u05e9-\u043c-\u03bd";
        nowide::args a(argc,argv,env);
        if(argc==2 && argv[1][0]!='-') {
            TEST(argv[1]==example);
            TEST(argv[2] == 0);
            TEST(nowide::getenv("NOWIDE_TEST"));
            TEST(nowide::getenv("NOWIDE_TEST_NONE") == 0);
            TEST(nowide::getenv("NOWIDE_TEST")==example);
            std::string sample = "NOWIDE_TEST=" + example;
            bool found = false;
            for(char **e=env;*e!=0;e++) {
				char *eptr = *e;
				//printf("%s\n",eptr);
                char *key_end = strchr(eptr,'=');
                TEST(key_end);
                std::string key = std::string(eptr,key_end);
                std::string value = key_end + 1;
		        TEST(nowide::getenv(key.c_str()));
                TEST(nowide::getenv(key.c_str()) == value);
                if(*e == sample)
                    found = true;
            }
            TEST(found);
            std::cout << "Subprocess ok" << std::endl;
        }
        else if(argc==2 && argv[1][0]=='-') {
            switch(argv[1][1]) {
            case 'w': 
                {
                    #ifdef NOWIDE_WINDOWS
                    std::wstring env = L"NOWIDE_TEST=" + wexample;
                    _wputenv(env.c_str());
                    std::wstring wcommand = nowide::widen(argv[0]);
                    wcommand += L" ";
                    wcommand += wexample;
                    TEST(_wsystem(wcommand.c_str()) == 0);
                    std::cout << "Wide Parent ok" << std::endl;
                    #else
                    std::cout << "Wide API is irrelevant" << std::endl;
                    #endif
                }
                return 0;
            case 'n':
                TEST(nowide::setenv("NOWIDE_TEST",example.c_str(),1) == 0);
                TEST(nowide::setenv("NOWIDE_TEST_NONE",example.c_str(),1) == 0);
                TEST(nowide::unsetenv("NOWIDE_TEST_NONE") == 0);
                break;
            default:
                std::cout << "Invalid parameters expected '-n/-w'" << std::endl;
                return 1;
            }
            std::string command = "\"";
            command += argv[0];
            command += "\" ";
            command += example;
            TEST(nowide::system(command.c_str()) == 0);
            std::cout << "Parent ok" << std::endl;
        }
        else {
            std::cerr << "Invalid parameters" << std::endl;
            return 1;
        }
        return 0;
    }
    catch(std::exception const &e) {
        std::cerr << "Failed " << e.what() << std::endl;
        return 1;
    }
}